

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashInsert(SyHash *pHash,SyHashEntry_Pr *pEntry)

{
  uint uVar1;
  sxu32 iBucket;
  SyHashEntry_Pr *pEntry_local;
  SyHash *pHash_local;
  
  uVar1 = pEntry->nHash & pHash->nBucketSize - 1;
  pEntry->pNextCollide = pHash->apBucket[uVar1];
  if (pHash->apBucket[uVar1] != (SyHashEntry_Pr *)0x0) {
    pHash->apBucket[uVar1]->pPrevCollide = pEntry;
  }
  pHash->apBucket[uVar1] = pEntry;
  if (pHash->pList == (SyHashEntry_Pr *)0x0) {
    pHash->pList = pEntry;
  }
  else {
    pEntry->pNext = pHash->pList;
    pHash->pList->pPrev = pEntry;
    pHash->pList = pEntry;
  }
  if (pHash->nEntry == 0) {
    pHash->pCurrent = pHash->pList;
  }
  pHash->nEntry = pHash->nEntry + 1;
  return 0;
}

Assistant:

static sxi32 HashInsert(SyHash *pHash, SyHashEntry_Pr *pEntry)
{
	sxu32 iBucket = pEntry->nHash & (pHash->nBucketSize - 1);
	/* Insert the entry in its corresponding bcuket */
	pEntry->pNextCollide = pHash->apBucket[iBucket];
	if( pHash->apBucket[iBucket] != 0 ){
		pHash->apBucket[iBucket]->pPrevCollide = pEntry;
	}
	pHash->apBucket[iBucket] = pEntry;
	/* Link to the entry list */
	MACRO_LD_PUSH(pHash->pList, pEntry);
	if( pHash->nEntry == 0 ){
		pHash->pCurrent = pHash->pList;
	}
	pHash->nEntry++;
	return SXRET_OK;
}